

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_schedule(Executor *this,Node *node)

{
  pointer pBVar1;
  ulong uVar2;
  pthread_mutex_t *__mutex;
  
  pBVar1 = (this->_buffers)._buckets.
           super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)node %
          (ulong)(((long)(this->_buffers)._buckets.
                         super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x180);
  __mutex = (pthread_mutex_t *)(pBVar1 + uVar2);
  std::mutex::lock((mutex *)&__mutex->__data);
  UnboundedTaskQueue<tf::Node_*>::push
            (&(this->_buffers)._buckets.
              super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar2].queue,node);
  pthread_mutex_unlock(__mutex);
  NonblockingNotifierV2::_notify<false>(&this->_notifier);
  return;
}

Assistant:

inline void Executor::_schedule(Node* node) {
  _buffers.push(node);
  _notifier.notify_one();
}